

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
LPFreadValue<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,char **pos,SPxOut *spxout)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  bool bVar7;
  char *pcVar8;
  byte *pbVar9;
  double a;
  char tmp [8192];
  int local_2038 [2050];
  
  pcVar8 = *(char **)this;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,1.0,(type *)0x0);
  if ((*pcVar8 == '-') || (*pcVar8 == '+')) {
    pcVar8 = pcVar8 + 1;
  }
  pbVar9 = (byte *)(pcVar8 + -1);
  bVar2 = false;
  do {
    bVar7 = bVar2;
    bVar3 = pbVar9[1];
    pbVar9 = pbVar9 + 1;
    bVar2 = true;
  } while ((byte)(bVar3 - 0x30) < 10);
  bVar2 = bVar7;
  if (bVar3 == 0x2e) {
    do {
      bVar7 = bVar2;
      bVar3 = pbVar9[1];
      pbVar9 = pbVar9 + 1;
      bVar2 = true;
    } while ((byte)(bVar3 - 0x30) < 10);
  }
  iVar4 = tolower((int)(char)bVar3);
  if (iVar4 == 0x65) {
    if ((pbVar9[1] == 0x2d) || (pbVar9[1] == 0x2b)) {
      pbVar9 = pbVar9 + 2;
    }
    else {
      pbVar9 = pbVar9 + 1;
    }
    pbVar9 = pbVar9 + -1;
    bVar3 = 1;
    do {
      bVar1 = bVar3;
      pbVar5 = pbVar9 + 1;
      pbVar9 = pbVar9 + 1;
      bVar3 = 0;
    } while ((byte)(*pbVar5 - 0x30) < 10);
    if ((!(bool)(~bVar1 & 1 | pos == (char **)0x0)) && (0 < *(int *)(pos + 1))) {
      local_2038[0] = *(int *)(pos + 1);
      (**(code **)(*pos + 0x10))(pos);
      operator<<((SPxOut *)pos,
                 "WLPFRD01 Warning: found empty exponent in LP file - check for forbidden variable names with initial \'e\' or \'E\'\n"
                );
      (**(code **)(*pos + 0x10))(pos,local_2038);
    }
  }
  pbVar5 = *(byte **)this;
  if (bVar7) {
    pbVar6 = (byte *)local_2038;
    while (pbVar5 != pbVar9) {
      *pbVar6 = *pbVar5;
      pbVar6 = pbVar6 + 1;
      pbVar5 = pbVar5 + 1;
      *(byte **)this = pbVar5;
    }
    *pbVar6 = 0;
    a = atof((char *)local_2038);
  }
  else {
    a = *(double *)(&DAT_00478100 + (ulong)(*pbVar5 == 0x2d) * 8);
  }
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)__return_storage_ptr__,a);
  *(byte **)this = pbVar9;
  if (((ulong)*pbVar9 < 0x21) && ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) != 0)) {
    *(byte **)this = pbVar9 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

static R LPFreadValue(char*& pos, SPxOut* spxout)
{
   assert(LPFisValue(pos));

   char        tmp[SOPLEX_LPF_MAX_LINE_LEN];
   const char* s = pos;
   char*       t;
   R        value = 1.0;
   bool        has_digits = false;
   bool        has_emptyexponent = false;

   // 1. sign
   if((*s == '+') || (*s == '-'))
      s++;

   // 2. Digits before the decimal dot
   while((*s >= '0') && (*s <= '9'))
   {
      has_digits = true;
      s++;
   }

   // 3. Decimal dot
   if(*s == '.')
   {
      s++;

      // 4. If there was a dot, possible digit behind it
      while((*s >= '0') && (*s <= '9'))
      {
         has_digits = true;
         s++;
      }
   }

   // 5. Exponent
   if(tolower(*s) == 'e')
   {
      has_emptyexponent = true;
      s++;

      // 6. Exponent sign
      if((*s == '+') || (*s == '-'))
         s++;

      // 7. Exponent digits
      while((*s >= '0') && (*s <= '9'))
      {
         has_emptyexponent = false;
         s++;
      }
   }

   assert(s != pos);

   if(has_emptyexponent)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "WLPFRD01 Warning: found empty exponent in LP file - check for forbidden variable names with initial 'e' or 'E'\n";
                     )
   }

   if(!has_digits)
      value = (*pos == '-') ? -1.0 : 1.0;
   else
   {
      for(t = tmp; pos != s; pos++)
         *t++ = *pos;

      *t = '\0';
      value = atof(tmp);
   }

   pos += s - pos;

   assert(pos == s);

   SPxOut::debug(spxout, "DLPFRD01 LPFreadValue = {}\n", value);

   if(LPFisSpace(*pos))
      pos++;

   return value;
}